

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbis.c
# Opt level: O2

int vorbis_check_packet(buf_t *buf,uchar type)

{
  uchar *puVar1;
  uint uVar2;
  
  if (buf != (buf_t *)0x0) {
    uVar2 = 0;
    if ((((6 < buf->len) && (puVar1 = buf->data, *puVar1 == type)) && (puVar1[1] == 'v')) &&
       (((puVar1[2] == 'o' && (puVar1[3] == 'r')) && ((puVar1[4] == 'b' && (puVar1[5] == 'i')))))) {
      uVar2 = (uint)(puVar1[6] == 's');
    }
    return uVar2;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/vorbis.c",0x3d,
                "int vorbis_check_packet(buf_t *, unsigned char)");
}

Assistant:

int vorbis_check_packet(buf_t *buf, unsigned char type) {
  assert(buf != NULL);

  if (buf->len < VORBIS_HDR_SIZE)
    return 0;
  if (buf->data[0] != type)
    return 0;
  if ((buf->data[1] != VORBIS_SYNC_HDR_BYTE1) ||
      (buf->data[2] != VORBIS_SYNC_HDR_BYTE2) ||
      (buf->data[3] != VORBIS_SYNC_HDR_BYTE3) ||
      (buf->data[4] != VORBIS_SYNC_HDR_BYTE4) ||
      (buf->data[5] != VORBIS_SYNC_HDR_BYTE5) ||
      (buf->data[6] != VORBIS_SYNC_HDR_BYTE6))
    return 0;

  return 1;
}